

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

void __thiscall cppcms::rpc::json_call::check_not_notification(json_call *this)

{
  call_error *this_00;
  allocator local_39;
  string local_38;
  
  if (this->notification_ != true) {
    return;
  }
  this_00 = (call_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_38,"Notification method should not return response",&local_39);
  call_error::call_error(this_00,&local_38);
  __cxa_throw(this_00,&call_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

void json_call::check_not_notification()
	{
		if(notification())
			throw call_error("Notification method should not return response");
	}